

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Id __thiscall
dxil_spv::Converter::Impl::fixup_store_type_typed
          (Impl *this,ComponentType component_type,uint components,Id value)

{
  ComponentType output_type;
  bool bVar1;
  ComponentType input_type;
  Id IVar2;
  Builder *pBVar3;
  Builder *this_00;
  Operation *this_01;
  Operation *this_02;
  ComponentType local_56;
  uint local_54;
  ComponentType input_component_type;
  ComponentType output_component_type;
  uint i_1;
  Operation *cast_op;
  Operation *shuffle_op;
  Id local_38;
  uint i;
  Id u64_ids [4];
  Id local_1c;
  Id value_local;
  uint components_local;
  ComponentType component_type_local;
  Impl *this_local;
  
  if (component_type == U64) {
    memset(&local_38,0,0x10);
    for (shuffle_op._4_4_ = 0; shuffle_op._4_4_ < components >> 1;
        shuffle_op._4_4_ = shuffle_op._4_4_ + 1) {
      pBVar3 = builder(this);
      this_00 = builder(this);
      IVar2 = spv::Builder::makeUintType(this_00,0x20);
      IVar2 = spv::Builder::makeVectorType(pBVar3,IVar2,2);
      this_01 = allocate(this,OpVectorShuffle,IVar2);
      Operation::add_id(this_01,value);
      Operation::add_id(this_01,value);
      Operation::add_literal(this_01,shuffle_op._4_4_ << 1);
      Operation::add_literal(this_01,shuffle_op._4_4_ * 2 + 1);
      add(this,this_01,false);
      pBVar3 = builder(this);
      IVar2 = spv::Builder::makeUintType(pBVar3,0x40);
      this_02 = allocate(this,OpBitcast,IVar2);
      Operation::add_id(this_02,this_01->id);
      add(this,this_02,false);
      (&local_38)[shuffle_op._4_4_] = this_02->id;
    }
    for (local_54 = components >> 1; local_54 < components; local_54 = local_54 + 1) {
      pBVar3 = builder(this);
      IVar2 = spv::Builder::makeUint64Constant(pBVar3,0,false);
      (&local_38)[local_54] = IVar2;
    }
    pBVar3 = builder(this);
    IVar2 = spv::Builder::makeUintType(pBVar3,0x40);
    local_1c = build_vector(this,IVar2,&local_38,components);
  }
  else {
    output_type = get_effective_typed_resource_type(component_type);
    local_56 = component_type;
    if ((component_type == F16) && (bVar1 = support_native_fp16_operations(this), !bVar1)) {
      local_56 = convert_16bit_component_to_32bit(F16);
    }
    input_type = convert_component_to_unsigned(local_56);
    local_1c = value;
    if (output_type != input_type) {
      local_1c = build_value_cast(this,value,input_type,output_type,components);
    }
  }
  return local_1c;
}

Assistant:

spv::Id Converter::Impl::fixup_store_type_typed(DXIL::ComponentType component_type, unsigned components, spv::Id value)
{
	if (component_type == DXIL::ComponentType::U64)
	{
		// If the component type is U64 it's used for atomics, but load/store interface is still 32-bit.
		// Bit-cast rather than value cast.
		spv::Id u64_ids[4] = {};
		for (unsigned i = 0; i < components / 2; i++)
		{
			auto *shuffle_op = allocate(spv::OpVectorShuffle, builder().makeVectorType(builder().makeUintType(32), 2));
			shuffle_op->add_id(value);
			shuffle_op->add_id(value);
			shuffle_op->add_literal(2 * i + 0);
			shuffle_op->add_literal(2 * i + 1);
			add(shuffle_op);

			auto *cast_op = allocate(spv::OpBitcast, builder().makeUintType(64));
			cast_op->add_id(shuffle_op->id);
			add(cast_op);
			u64_ids[i] = cast_op->id;
		}

		for (unsigned i = components / 2; i < components; i++)
			u64_ids[i] = builder().makeUint64Constant(0);

		value = build_vector(builder().makeUintType(64), u64_ids, components);
	}
	else
	{
		auto output_component_type = get_effective_typed_resource_type(component_type);
		auto input_component_type = component_type;

		if (input_component_type == DXIL::ComponentType::F16 && !support_native_fp16_operations())
			input_component_type = convert_16bit_component_to_32bit(input_component_type);
		input_component_type = convert_component_to_unsigned(input_component_type);

		if (output_component_type != input_component_type)
			value = build_value_cast(value, input_component_type, output_component_type, components);
	}

	return value;
}